

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall wabt::Var::set_name(Var *this,string *name)

{
  long *plVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  pointer pcVar5;
  undefined8 uVar6;
  
  if (this->type_ == Name) {
    plVar4 = (long *)(this->field_2).name_._M_dataplus._M_p;
    plVar1 = (long *)((long)&this->field_2 + 0x10);
    if (plVar4 != plVar1) {
      operator_delete(plVar4,*plVar1 + 1);
    }
  }
  this->type_ = Name;
  psVar2 = (size_type *)((long)&this->field_2 + 0x10);
  *(size_type **)&this->field_2 = psVar2;
  pcVar5 = (name->_M_dataplus)._M_p;
  paVar3 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar3) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    *psVar2 = paVar3->_M_allocated_capacity;
    *(undefined8 *)((long)&this->field_2 + 0x18) = uVar6;
  }
  else {
    (this->field_2).name_._M_dataplus._M_p = pcVar5;
    *(size_type *)((long)&this->field_2 + 0x10) = paVar3->_M_allocated_capacity;
  }
  (this->field_2).name_._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar3;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

void Var::set_name(std::string&& name) {
  Destroy();
  type_ = VarType::Name;
  Construct(name_, std::move(name));
}